

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O2

UA_StatusCode
UA_Server_addMethodNode
          (UA_Server *server,UA_NodeId requestedNewNodeId,UA_NodeId parentNodeId,
          UA_NodeId referenceTypeId,UA_QualifiedName browseName,UA_MethodAttributes attr,
          UA_MethodCallback method,void *handle,size_t inputArgumentsSize,
          UA_Argument *inputArguments,size_t outputArgumentsSize,UA_Argument *outputArguments,
          UA_NodeId *outNewNodeId)

{
  UA_UInt32 *pUVar1;
  UA_StatusCode UVar2;
  UA_Node *pUVar3;
  char *text;
  char *text_00;
  UA_String UVar4;
  undefined1 local_1b0 [8];
  UA_AddNodesItem item;
  UA_Byte *pUStack_b0;
  size_t local_a8;
  UA_Byte *pUStack_a0;
  undefined1 local_98 [8];
  UA_NodeId hasproperty;
  UA_NodeId propertytype;
  undefined1 auStack_48 [8];
  UA_NodeId newMethodId;
  
  pUVar3 = UA_NodeStore_newNode(UA_NODECLASS_METHOD);
  if (pUVar3 == (UA_Node *)0x0) {
    UVar2 = 0x80030000;
  }
  else {
    memset((UA_AddNodesItem *)local_1b0,0,0xf8);
    item.referenceTypeId.identifier.string.data = (UA_Byte *)requestedNewNodeId._0_8_;
    item.requestedNewNodeId.nodeId.namespaceIndex = requestedNewNodeId.identifier._0_2_;
    item.requestedNewNodeId.nodeId._2_2_ = requestedNewNodeId.identifier._2_2_;
    item.requestedNewNodeId.nodeId.identifierType = requestedNewNodeId.identifier._4_4_;
    item.requestedNewNodeId.nodeId.identifier.string.length =
         (size_t)requestedNewNodeId.identifier.string.data;
    item.requestedNewNodeId._40_8_ = browseName._0_8_;
    item.browseName._0_8_ = browseName.name.length;
    item.browseName.name.length = (size_t)browseName.name.data;
    copyStandardAttributes(pUVar3,(UA_AddNodesItem *)local_1b0,(UA_NodeAttributes *)&attr);
    *(UA_Boolean *)&pUVar3[1].nodeId.namespaceIndex = attr.executable;
    *(UA_Boolean *)((long)&pUVar3[1].nodeId.namespaceIndex + 1) = attr.userExecutable;
    pUVar3[1].nodeId.identifier.string.data = (UA_Byte *)method;
    pUVar3[1].nodeId.identifier.string.length = (size_t)handle;
    auStack_48._0_2_ = 0;
    auStack_48._2_2_ = 0;
    auStack_48._4_4_ = UA_NODEIDTYPE_NUMERIC;
    newMethodId.namespaceIndex = 0;
    newMethodId._2_2_ = 0;
    newMethodId.identifierType = UA_NODEIDTYPE_NUMERIC;
    newMethodId.identifier.string.length = 0;
    UVar2 = Service_AddNodes_existing
                      (server,&adminSession,pUVar3,&parentNodeId,&referenceTypeId,&UA_NODEID_NULL,
                       (UA_InstantiationCallback *)0x0,(UA_NodeId *)auStack_48);
    if (UVar2 == 0) {
      local_98._0_2_ = 0;
      hasproperty.identifier._8_2_ = 0;
      stack0xffffffffffffff6c = 0x2e00000000;
      stack0xffffffffffffff84 = 0x4400000000;
      if (inputArgumentsSize != 0) {
        pUVar3 = UA_NodeStore_newNode(UA_NODECLASS_VARIABLE);
        (pUVar3->nodeId).namespaceIndex = auStack_48._0_2_;
        UVar4 = UA_String_fromChars("InputArguments");
        (pUVar3->browseName).namespaceIndex = 0;
        (pUVar3->browseName).name = UVar4;
        pUVar1 = &item.typeDefinition.serverIndex;
        UA_LOCALIZEDTEXT_ALLOC((UA_LocalizedText *)pUVar1,"InputArguments",(char *)UVar4.data);
        (pUVar3->displayName).text.length = local_a8;
        (pUVar3->displayName).text.data = pUStack_a0;
        (pUVar3->displayName).locale.length = item.typeDefinition._40_8_;
        (pUVar3->displayName).locale.data = pUStack_b0;
        UA_LOCALIZEDTEXT_ALLOC((UA_LocalizedText *)pUVar1,"InputArguments",text);
        (pUVar3->description).text.length = local_a8;
        (pUVar3->description).text.data = pUStack_a0;
        (pUVar3->description).locale.length = item.typeDefinition._40_8_;
        (pUVar3->description).locale.data = pUStack_b0;
        pUVar3[1].nodeClass = UA_NODECLASS_OBJECT;
        pUVar3[2].browseName.name.length = 0x40c3880000000000;
        if (((auStack_48._0_2_ == 0) && (auStack_48._4_4_ == UA_NODEIDTYPE_NUMERIC)) &&
           (newMethodId._0_4_ == 0x2ce4)) {
          (pUVar3->nodeId).namespaceIndex = 0;
          *(undefined8 *)&(pUVar3->nodeId).identifierType = 0x2ce500000000;
        }
        UA_Variant_setArrayCopy
                  ((UA_Variant *)&pUVar3[1].displayName.locale.data,inputArguments,
                   inputArgumentsSize,UA_TYPES + 0x39);
        *(byte *)&pUVar3[1].displayName.locale.length =
             (byte)pUVar3[1].displayName.locale.length | 1;
        Service_AddNodes_existing
                  (server,&adminSession,pUVar3,(UA_NodeId *)auStack_48,(UA_NodeId *)local_98,
                   (UA_NodeId *)((long)&hasproperty.identifier + 8),(UA_InstantiationCallback *)0x0,
                   (UA_NodeId *)0x0);
      }
      if (outputArgumentsSize != 0) {
        pUVar3 = UA_NodeStore_newNode(UA_NODECLASS_VARIABLE);
        (pUVar3->nodeId).namespaceIndex = auStack_48._0_2_;
        UVar4 = UA_String_fromChars("OutputArguments");
        (pUVar3->browseName).namespaceIndex = 0;
        (pUVar3->browseName).name = UVar4;
        pUVar1 = &item.typeDefinition.serverIndex;
        UA_LOCALIZEDTEXT_ALLOC((UA_LocalizedText *)pUVar1,"OutputArguments",(char *)UVar4.data);
        (pUVar3->displayName).text.length = local_a8;
        (pUVar3->displayName).text.data = pUStack_a0;
        (pUVar3->displayName).locale.length = item.typeDefinition._40_8_;
        (pUVar3->displayName).locale.data = pUStack_b0;
        UA_LOCALIZEDTEXT_ALLOC((UA_LocalizedText *)pUVar1,"OutputArguments",text_00);
        (pUVar3->description).text.length = local_a8;
        (pUVar3->description).text.data = pUStack_a0;
        (pUVar3->description).locale.length = item.typeDefinition._40_8_;
        (pUVar3->description).locale.data = pUStack_b0;
        pUVar3[1].nodeClass = UA_NODECLASS_OBJECT;
        if (((auStack_48._0_2_ == 0) && (auStack_48._4_4_ == UA_NODEIDTYPE_NUMERIC)) &&
           (newMethodId._0_4_ == 0x2ce4)) {
          (pUVar3->nodeId).namespaceIndex = 0;
          *(undefined8 *)&(pUVar3->nodeId).identifierType = 0x2ce600000000;
        }
        UA_Variant_setArrayCopy
                  ((UA_Variant *)&pUVar3[1].displayName.locale.data,outputArguments,
                   outputArgumentsSize,UA_TYPES + 0x39);
        *(byte *)&pUVar3[1].displayName.locale.length =
             (byte)pUVar3[1].displayName.locale.length | 1;
        Service_AddNodes_existing
                  (server,&adminSession,pUVar3,(UA_NodeId *)auStack_48,(UA_NodeId *)local_98,
                   (UA_NodeId *)((long)&hasproperty.identifier + 8),(UA_InstantiationCallback *)0x0,
                   (UA_NodeId *)0x0);
      }
      if (outNewNodeId == (UA_NodeId *)0x0) {
        UA_NodeId_deleteMembers((UA_NodeId *)auStack_48);
      }
      else {
        (outNewNodeId->identifier).string.data = (UA_Byte *)newMethodId.identifier.string.length;
        outNewNodeId->namespaceIndex = auStack_48._0_2_;
        *(undefined2 *)&outNewNodeId->field_0x2 = auStack_48._2_2_;
        outNewNodeId->identifierType = auStack_48._4_4_;
        (outNewNodeId->identifier).string.length = newMethodId._0_8_;
      }
    }
  }
  return UVar2;
}

Assistant:

UA_StatusCode
UA_Server_addMethodNode(UA_Server *server, const UA_NodeId requestedNewNodeId,
                        const UA_NodeId parentNodeId, const UA_NodeId referenceTypeId,
                        const UA_QualifiedName browseName, const UA_MethodAttributes attr,
                        UA_MethodCallback method, void *handle,
                        size_t inputArgumentsSize, const UA_Argument* inputArguments,
                        size_t outputArgumentsSize, const UA_Argument* outputArguments,
                        UA_NodeId *outNewNodeId) {
    UA_MethodNode *node = UA_NodeStore_newMethodNode();
    if(!node)
        return UA_STATUSCODE_BADOUTOFMEMORY;

    UA_AddNodesItem item;
    UA_AddNodesItem_init(&item);
    item.requestedNewNodeId.nodeId = requestedNewNodeId;
    item.browseName = browseName;
    copyStandardAttributes((UA_Node*)node, &item, (const UA_NodeAttributes*)&attr);
    node->executable = attr.executable;
    node->userExecutable = attr.userExecutable;
    node->attachedMethod = method;
    node->methodHandle = handle;

    /* Add the node */
    UA_NodeId newMethodId;
    UA_NodeId_init(&newMethodId);
    UA_RCU_LOCK();
    UA_StatusCode retval = Service_AddNodes_existing(server, &adminSession, (UA_Node*)node, &parentNodeId,
                                                     &referenceTypeId, &UA_NODEID_NULL, NULL, &newMethodId);
    UA_RCU_UNLOCK();
    if(retval != UA_STATUSCODE_GOOD)
        return retval;

    const UA_NodeId hasproperty = UA_NODEID_NUMERIC(0, UA_NS0ID_HASPROPERTY);
    const UA_NodeId propertytype = UA_NODEID_NUMERIC(0, UA_NS0ID_PROPERTYTYPE);

    if(inputArgumentsSize > 0) {
        UA_VariableNode *inputArgumentsVariableNode = UA_NodeStore_newVariableNode();
        inputArgumentsVariableNode->nodeId.namespaceIndex = newMethodId.namespaceIndex;
        inputArgumentsVariableNode->browseName = UA_QUALIFIEDNAME_ALLOC(0, "InputArguments");
        inputArgumentsVariableNode->displayName = UA_LOCALIZEDTEXT_ALLOC("en_US", "InputArguments");
        inputArgumentsVariableNode->description = UA_LOCALIZEDTEXT_ALLOC("en_US", "InputArguments");
        inputArgumentsVariableNode->valueRank = 1;

        /* UAExpert creates a monitoreditem on inputarguments ... */
        inputArgumentsVariableNode->minimumSamplingInterval = 10000.0f;

        //TODO: 0.3 work item: the addMethodNode API does not have the possibility to set nodeIDs
        //actually we need to change the signature to pass UA_NS0ID_SERVER_GETMONITOREDITEMS_INPUTARGUMENTS
        //and UA_NS0ID_SERVER_GETMONITOREDITEMS_OUTPUTARGUMENTS into the function :/
        if(newMethodId.namespaceIndex == 0 &&
           newMethodId.identifierType == UA_NODEIDTYPE_NUMERIC &&
           newMethodId.identifier.numeric == UA_NS0ID_SERVER_GETMONITOREDITEMS) {
            inputArgumentsVariableNode->nodeId =
                UA_NODEID_NUMERIC(0, UA_NS0ID_SERVER_GETMONITOREDITEMS_INPUTARGUMENTS);
        }
        UA_Variant_setArrayCopy(&inputArgumentsVariableNode->value.data.value.value,
                                inputArguments, inputArgumentsSize,
                                &UA_TYPES[UA_TYPES_ARGUMENT]);
        inputArgumentsVariableNode->value.data.value.hasValue = true;
        UA_RCU_LOCK();
        // todo: check if adding succeeded
        Service_AddNodes_existing(server, &adminSession, (UA_Node*)inputArgumentsVariableNode,
                                  &newMethodId, &hasproperty, &propertytype, NULL, NULL);
        UA_RCU_UNLOCK();
    }

    if(outputArgumentsSize > 0) {
        /* create OutputArguments */
        UA_VariableNode *outputArgumentsVariableNode  = UA_NodeStore_newVariableNode();
        outputArgumentsVariableNode->nodeId.namespaceIndex = newMethodId.namespaceIndex;
        outputArgumentsVariableNode->browseName  = UA_QUALIFIEDNAME_ALLOC(0, "OutputArguments");
        outputArgumentsVariableNode->displayName = UA_LOCALIZEDTEXT_ALLOC("en_US", "OutputArguments");
        outputArgumentsVariableNode->description = UA_LOCALIZEDTEXT_ALLOC("en_US", "OutputArguments");
        outputArgumentsVariableNode->valueRank = 1;
        //FIXME: comment in line 882
        if(newMethodId.namespaceIndex == 0 &&
           newMethodId.identifierType == UA_NODEIDTYPE_NUMERIC &&
           newMethodId.identifier.numeric == UA_NS0ID_SERVER_GETMONITOREDITEMS) {
            outputArgumentsVariableNode->nodeId =
                UA_NODEID_NUMERIC(0, UA_NS0ID_SERVER_GETMONITOREDITEMS_OUTPUTARGUMENTS);
        }
        UA_Variant_setArrayCopy(&outputArgumentsVariableNode->value.data.value.value,
                                outputArguments, outputArgumentsSize,
                                &UA_TYPES[UA_TYPES_ARGUMENT]);
        outputArgumentsVariableNode->value.data.value.hasValue = true;
        UA_RCU_LOCK();
        // todo: check if adding succeeded
        Service_AddNodes_existing(server, &adminSession, (UA_Node*)outputArgumentsVariableNode,
                                  &newMethodId, &hasproperty, &propertytype, NULL, NULL);
        UA_RCU_UNLOCK();
    }

    if(outNewNodeId)
        *outNewNodeId = newMethodId;
    else
        UA_NodeId_deleteMembers(&newMethodId);
    return retval;
}